

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O1

REF_STATUS ref_swap_remove_three_face_cell(REF_GRID ref_grid,REF_INT cell)

{
  REF_CELL ref_cell;
  REF_INT *pRVar1;
  REF_INT *pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  REF_INT found;
  REF_INT face_nodes [4];
  REF_INT cell_nodes [4];
  REF_INT face;
  REF_INT cell_face_nodes [4];
  int local_b8;
  int local_b4;
  int local_b0;
  REF_INT local_ac;
  int local_a8;
  REF_INT local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  undefined8 local_88;
  int local_80;
  int local_7c;
  REF_GRID local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  REF_INT local_4c;
  REF_INT local_48 [6];
  
  ref_cell = ref_grid->cell[8];
  local_b0 = -1;
  lVar7 = 0;
  lVar11 = 0;
  local_b4 = -1;
  local_b8 = -1;
  local_98 = -1;
  local_a0 = -1;
  local_94 = -1;
  local_a8 = -1;
  local_9c = -1;
  local_90 = -1;
  local_a4 = cell;
  local_70 = ref_grid;
  do {
    pRVar1 = ref_cell->c2n;
    pRVar2 = ref_cell->f2n;
    lVar5 = 0;
    do {
      local_48[lVar5] =
           pRVar1[(long)ref_cell->size_per * (long)cell +
                  (long)*(int *)((long)pRVar2 + lVar5 * 4 + lVar7)];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    RVar3 = ref_cell_with(ref_grid->cell[3],local_48,&local_ac);
    if (RVar3 == 0) {
      uVar4 = ref_cell_nodes(ref_grid->cell[3],local_ac,(REF_INT *)&local_88);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x7f
               ,"ref_swap_remove_three_face_cell",(ulong)uVar4,"tri");
        return uVar4;
      }
      iVar10 = (int)lVar11;
      ref_grid = local_70;
      if (local_b0 == -1) {
        local_b0 = local_ac;
        local_a8 = local_7c;
        local_98 = iVar10;
      }
      else if (local_b4 == -1) {
        local_b4 = local_ac;
        local_9c = local_7c;
        local_a0 = iVar10;
      }
      else {
        if (local_b8 != -1) {
          pcVar9 = "four faces detected";
          uVar4 = 3;
          uVar6 = 0x8a;
          uVar8 = 3;
          goto LAB_00224ddd;
        }
        local_b8 = local_ac;
        local_90 = local_7c;
        local_94 = iVar10;
      }
    }
    lVar11 = lVar11 + 1;
    lVar7 = lVar7 + 0x10;
  } while (lVar11 != 4);
  uVar4 = 3;
  if (((local_b8 != -1 && (local_b4 != -1 && local_b0 != -1)) && (local_a8 == local_9c)) &&
     (local_a8 == local_90)) {
    uVar4 = ref_cell_remove(ref_grid->cell[3],local_b0);
    if (uVar4 == 0) {
      uVar4 = ref_cell_remove(ref_grid->cell[3],local_b4);
      if (uVar4 == 0) {
        uVar4 = ref_cell_remove(ref_grid->cell[3],local_b8);
        if (uVar4 == 0) {
          pRVar1 = ref_cell->c2n;
          pRVar2 = ref_cell->f2n;
          lVar7 = 0;
          do {
            *(REF_INT *)((long)&local_88 + lVar7 * 4) =
                 pRVar1[(long)ref_cell->size_per * (long)cell +
                        (long)pRVar2[((local_a0 + local_94 + local_98) * -4 + 0x18) + lVar7]];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 4);
          local_7c = local_a8;
          local_88 = local_88 << 0x20 | local_88 >> 0x20;
          uVar4 = ref_cell_add(ref_grid->cell[3],(REF_INT *)&local_88,&local_4c);
          if (uVar4 == 0) {
            uVar4 = ref_cell_nodes(ref_cell,local_a4,&local_68);
            if (uVar4 == 0) {
              iVar10 = (int)local_88 + local_88._4_4_;
              uVar4 = ref_cell_remove(ref_cell,local_a4);
              if (uVar4 == 0) {
                uVar4 = ref_node_remove(ref_grid->node,
                                        (local_64 + local_68 + local_60 + local_5c) -
                                        (iVar10 + local_80));
                if (uVar4 == 0) {
                  uVar4 = 0;
                }
                else {
                  pcVar9 = "remove node";
                  uVar6 = 0xb0;
                  uVar8 = (ulong)uVar4;
LAB_00224ddd:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                         ,uVar6,"ref_swap_remove_three_face_cell",uVar8,pcVar9);
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                       ,0xad,"ref_swap_remove_three_face_cell",(ulong)uVar4,"remove tet");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                     ,0xa7,"ref_swap_remove_three_face_cell",(ulong)uVar4,"tet");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0xa5,"ref_swap_remove_three_face_cell",(ulong)uVar4,"add tri");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x9a,"ref_swap_remove_three_face_cell",(ulong)uVar4,"remove tri1");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x99
               ,"ref_swap_remove_three_face_cell",(ulong)uVar4,"remove tri1");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x98,
             "ref_swap_remove_three_face_cell",(ulong)uVar4,"remove tri0");
    }
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_swap_remove_three_face_cell(REF_GRID ref_grid,
                                                   REF_INT cell) {
  REF_CELL ref_cell;
  REF_INT cell_face;
  REF_INT node;
  REF_INT cell_nodes[4];
  REF_INT cell_face_nodes[4];
  REF_INT face_nodes[4];
  REF_INT found;
  REF_INT face0, face1, face2;
  REF_INT cell_face0, cell_face1, cell_face2;
  REF_INT faceid0, faceid1, faceid2;
  REF_INT temp, face;
  REF_INT remove_this_node;

  ref_cell = ref_grid_tet(ref_grid);

  face0 = REF_EMPTY;
  face1 = REF_EMPTY;
  face2 = REF_EMPTY;
  faceid0 = REF_EMPTY;
  faceid1 = REF_EMPTY;
  faceid2 = REF_EMPTY;
  cell_face0 = REF_EMPTY;
  cell_face1 = REF_EMPTY;
  cell_face2 = REF_EMPTY;
  for (cell_face = 0; cell_face < 4; cell_face++) {
    for (node = 0; node < 4; node++)
      cell_face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
    if (REF_SUCCESS ==
        ref_cell_with(ref_grid_tri(ref_grid), cell_face_nodes, &found)) {
      RSS(ref_cell_nodes(ref_grid_tri(ref_grid), found, face_nodes), "tri");
      if (REF_EMPTY == face0) {
        face0 = found;
        faceid0 = face_nodes[3];
        cell_face0 = cell_face;
      } else if (REF_EMPTY == face1) {
        face1 = found;
        faceid1 = face_nodes[3];
        cell_face1 = cell_face;
      } else {
        if (REF_EMPTY != face2) {
          RSS(REF_INVALID, "four faces detected");
        }
        face2 = found;
        faceid2 = face_nodes[3];
        cell_face2 = cell_face;
      }
    }
  }

  if (REF_EMPTY == face0) return REF_INVALID;
  if (REF_EMPTY == face1) return REF_INVALID;
  if (REF_EMPTY == face2) return REF_INVALID;
  if (faceid0 != faceid1 || faceid0 != faceid2) return REF_INVALID;

  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face0), "remove tri0");
  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face1), "remove tri1");
  RSS(ref_cell_remove(ref_grid_tri(ref_grid), face2), "remove tri1");

  cell_face = 0 + 1 + 2 + 3 - cell_face0 - cell_face1 - cell_face2;

  for (node = 0; node < 4; node++)
    face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);

  face_nodes[3] = faceid0;
  temp = face_nodes[0];
  face_nodes[0] = face_nodes[1];
  face_nodes[1] = temp;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), face_nodes, &face), "add tri");

  RSS(ref_cell_nodes(ref_cell, cell, cell_nodes), "tet");

  remove_this_node = cell_nodes[0] + cell_nodes[1] + cell_nodes[2] +
                     cell_nodes[3] - face_nodes[0] - face_nodes[1] -
                     face_nodes[2];

  RSS(ref_cell_remove(ref_cell, cell), "remove tet");

  RSS(ref_node_remove(ref_grid_node(ref_grid), remove_this_node),
      "remove node");

  return REF_SUCCESS;
}